

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

ptr<log_entry> nuraft::inmem_log_store::make_clone(ptr<log_entry> *entry)

{
  log_val_type lVar1;
  element_type *peVar2;
  buffer *__child_stack;
  unsigned_long *args_3;
  void *in_RCX;
  int __flags;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  log_entry *in_RDI;
  ptr<log_entry> pVar3;
  ptr<log_entry> *clone;
  log_entry *this;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 local_30 [16];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  peVar2 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x19738a);
  local_20 = log_entry::get_term(peVar2);
  std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1973a1);
  __child_stack = log_entry::get_buf(this);
  nuraft::buffer::clone((__fn *)local_30,__child_stack,__flags,in_RCX);
  peVar2 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1973c0);
  lVar1 = log_entry::get_val_type(peVar2);
  peVar2 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1973e0);
  args_3 = (unsigned_long *)log_entry::get_timestamp(peVar2);
  cs_new<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)CONCAT17(lVar1,in_stack_ffffffffffffffa8),
             (shared_ptr<nuraft::buffer> *)this,(log_val_type *)in_RDI,args_3);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x197423);
  pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<log_entry>)pVar3.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<log_entry> inmem_log_store::make_clone(const ptr<log_entry>& entry) {
    // NOTE:
    //   Timestamp is used only when `replicate_log_timestamp_` option is on.
    //   Otherwise, log store does not need to store or load it.
    ptr<log_entry> clone = cs_new<log_entry>
                           ( entry->get_term(),
                             buffer::clone( entry->get_buf() ),
                             entry->get_val_type(),
                             entry->get_timestamp() );
    return clone;
}